

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void vocdusave_newobj(voccxdef *ctx,objnum objn)

{
  long lVar1;
  uchar *puVar2;
  ushort in_SI;
  long in_RDI;
  uchar *p;
  objucxdef *uc;
  ushort in_stack_ffffffffffffffdc;
  uchar in_stack_ffffffffffffffdf;
  objucxdef *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  puVar2 = objures(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffdc);
  *puVar2 = '\x02';
  oswp2(puVar2 + 1,(uint)in_SI);
  *(short *)(lVar1 + 0x12) = *(short *)(lVar1 + 0x12) + 3;
  return;
}

Assistant:

void vocdusave_newobj(voccxdef *ctx, objnum objn)
{
    objucxdef *uc = ctx->voccxundo;
    uchar     *p;

    p = objures(uc, OBJUCLI, 3);
    *p = VOC_UNDO_NEWOBJ;
    oswp2(p+1, objn);

    uc->objucxhead += 3;
}